

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_153ab3::BinaryExpr::printLeft(BinaryExpr *this,OutputStream *S)

{
  bool bVar1;
  StringView local_a8;
  StringView local_98;
  StringView local_88;
  StringView local_78;
  char *local_68;
  char *local_60;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  BinaryExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,">");
  bVar1 = ::operator==(&this->InfixOperator,&local_28);
  if (bVar1) {
    StringView::StringView(&local_38,"(");
    OutputStream::operator+=(local_18,local_38);
  }
  StringView::StringView(&local_48,"(");
  OutputStream::operator+=(local_18,local_48);
  Node::print(this->LHS,local_18);
  StringView::StringView(&local_58,") ");
  OutputStream::operator+=(local_18,local_58);
  local_68 = (this->InfixOperator).First;
  local_60 = (this->InfixOperator).Last;
  OutputStream::operator+=(local_18,this->InfixOperator);
  StringView::StringView(&local_78," (");
  OutputStream::operator+=(local_18,local_78);
  Node::print(this->RHS,local_18);
  StringView::StringView(&local_88,")");
  OutputStream::operator+=(local_18,local_88);
  StringView::StringView(&local_98,">");
  bVar1 = ::operator==(&this->InfixOperator,&local_98);
  if (bVar1) {
    StringView::StringView(&local_a8,")");
    OutputStream::operator+=(local_18,local_a8);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    // might be a template argument expression, then we need to disambiguate
    // with parens.
    if (InfixOperator == ">")
      S += "(";

    S += "(";
    LHS->print(S);
    S += ") ";
    S += InfixOperator;
    S += " (";
    RHS->print(S);
    S += ")";

    if (InfixOperator == ">")
      S += ")";
  }